

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_lore_spells(parser *p)

{
  void *pvVar1;
  char *pcVar2;
  char *flag_name;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 != (void *)0x0) {
    pcVar2 = parser_getstr(p,"spells");
    pcVar2 = string_make(pcVar2);
    flag_name = strtok(pcVar2," |");
    if (flag_name != (char *)0x0) {
      do {
        grab_flag((bitflag *)((long)pvVar1 + 0x2b),0xc,r_info_spell_flags,flag_name);
        flag_name = strtok((char *)0x0," |");
      } while (flag_name != (char *)0x0);
    }
    mem_free(pcVar2);
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_lore_spells(struct parser *p) {
	struct monster_lore *l = parser_priv(p);
	char *flags;
	char *s;
	int ret = PARSE_ERROR_NONE;

	if (!l)
		return PARSE_ERROR_NONE;
	flags = string_make(parser_getstr(p, "spells"));
	s = strtok(flags, " |");
	while (s) {
		(void) grab_flag(l->spell_flags, RSF_SIZE, r_info_spell_flags, s);
		s = strtok(NULL, " |");
	}

	mem_free(flags);
	return ret;
}